

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcp.cc
# Opt level: O0

void __thiscall XcpOptions::Init(XcpOptions *this,int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  int pre;
  char **argv_local;
  int argc_local;
  XcpOptions *this_local;
  
  common::Options::Init(&this->super_Options,argc,argv);
  vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->super_Options).opt_cur;
  while( true ) {
    bVar2 = false;
    if ((this->super_Options).opt_cur < argc) {
      bVar2 = (this->super_Options).opt_cur <
              vec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 2;
    }
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    pcVar1 = argv[(this->super_Options).opt_cur];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar1,&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,":",&local_99);
    xlib::Split((string *)local_60,(string *)local_98,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    if (sVar3 == 2) {
      if (vec.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == (this->super_Options).opt_cur)
      {
        this->remote_to_local = true;
      }
      else {
        this->local_to_remote = true;
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,0);
      common::Options::ParseHosts(&this->super_Options,pvVar4);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,1);
      std::__cxx11::string::operator=((string *)&this->remote_path,(string *)pvVar4);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,0);
      std::__cxx11::string::operator=((string *)&this->local_path,(string *)pvVar4);
    }
    (this->super_Options).opt_cur = (this->super_Options).opt_cur + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
  }
  return;
}

Assistant:

void Init(int argc, char **argv) {
        common::Options::Init(argc, argv);
        int pre = opt_cur;
        while ( opt_cur < argc && (pre + 2)>opt_cur ) {
            std::vector<std::string> vec;
            xlib::Split(argv[opt_cur], ":", &vec);
            if (vec.size() == 2) {
                (pre == opt_cur) ? remote_to_local = true : local_to_remote = true;
                common::Options::ParseHosts(vec[0]);
                remote_path = vec[1];
            } else {
                local_path = vec[0];
            }
            opt_cur++;
        }
    }